

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall
re2::Regexp::ParseState::PushRepeatOp(ParseState *this,RegexpOp op,StringPiece *s,bool nongreedy)

{
  bool bVar1;
  RegexpOp RVar2;
  ParseFlags PVar3;
  Regexp *this_00;
  Regexp *pRVar4;
  Regexp **ppRVar5;
  byte in_CL;
  StringPiece *in_RDX;
  RegexpOp in_ESI;
  ParseState *in_RDI;
  Regexp *re;
  ParseFlags fl;
  Regexp *in_stack_00000168;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  ParseFlags in_stack_ffffffffffffffac;
  ParseFlags local_28;
  
  if (in_RDI->stacktop_ != (Regexp *)0x0) {
    RVar2 = Regexp::op(in_RDI->stacktop_);
    bVar1 = IsMarker(in_RDI,RVar2);
    if (!bVar1) {
      local_28 = in_RDI->flags_;
      if ((in_CL & 1) != 0) {
        local_28 = operator^(local_28,NonGreedy);
      }
      RVar2 = Regexp::op(in_RDI->stacktop_);
      if ((in_ESI == RVar2) && (PVar3 = parse_flags(in_RDI->stacktop_), local_28 == PVar3)) {
        return true;
      }
      RVar2 = Regexp::op(in_RDI->stacktop_);
      if ((((RVar2 == kRegexpStar) || (RVar2 = Regexp::op(in_RDI->stacktop_), RVar2 == kRegexpPlus))
          || (RVar2 = Regexp::op(in_RDI->stacktop_), RVar2 == kRegexpQuest)) &&
         (PVar3 = parse_flags(in_RDI->stacktop_), in_stack_ffffffffffffffac = local_28,
         local_28 == PVar3)) {
        in_RDI->stacktop_->op_ = '\a';
        return true;
      }
      this_00 = (Regexp *)operator_new(0x28);
      Regexp(this_00,(RegexpOp)((ulong)in_stack_ffffffffffffff98 >> 0x20),
             (ParseFlags)in_stack_ffffffffffffff98);
      pRVar4 = this_00;
      AllocSub(this_00,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      this_00->down_ = in_RDI->stacktop_->down_;
      pRVar4 = FinishRegexp((ParseState *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),pRVar4);
      ppRVar5 = Regexp::sub(this_00);
      *ppRVar5 = pRVar4;
      bVar1 = ComputeSimple(in_stack_00000168);
      this_00->simple_ = bVar1;
      in_RDI->stacktop_ = this_00;
      return true;
    }
  }
  RegexpStatus::set_code(in_RDI->status_,kRegexpRepeatArgument);
  RegexpStatus::set_error_arg(in_RDI->status_,in_RDX);
  return false;
}

Assistant:

bool Regexp::ParseState::PushRepeatOp(RegexpOp op, const StringPiece& s,
                                      bool nongreedy) {
  if (stacktop_ == NULL || IsMarker(stacktop_->op())) {
    status_->set_code(kRegexpRepeatArgument);
    status_->set_error_arg(s);
    return false;
  }
  Regexp::ParseFlags fl = flags_;
  if (nongreedy)
    fl = fl ^ NonGreedy;

  // Squash **, ++ and ??. Regexp::Star() et al. handle this too, but
  // they're mostly for use during simplification, not during parsing.
  if (op == stacktop_->op() && fl == stacktop_->parse_flags())
    return true;

  // Squash *+, *?, +*, +?, ?* and ?+. They all squash to *, so because
  // op is a repeat, we just have to check that stacktop_->op() is too,
  // then adjust stacktop_.
  if ((stacktop_->op() == kRegexpStar ||
       stacktop_->op() == kRegexpPlus ||
       stacktop_->op() == kRegexpQuest) &&
      fl == stacktop_->parse_flags()) {
    stacktop_->op_ = kRegexpStar;
    return true;
  }

  Regexp* re = new Regexp(op, fl);
  re->AllocSub(1);
  re->down_ = stacktop_->down_;
  re->sub()[0] = FinishRegexp(stacktop_);
  re->simple_ = re->ComputeSimple();
  stacktop_ = re;
  return true;
}